

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void display_columns(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int pos;
  int iVar8;
  int iVar9;
  int h;
  int w;
  int col;
  int local_64;
  int local_58;
  int local_38;
  int local_34;
  
  piVar6 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar6 = &menu->count;
  }
  iVar1 = *piVar6;
  iVar2 = loc->col;
  iVar3 = loc->row;
  iVar4 = loc->page_rows;
  iVar5 = (iVar1 + iVar4 + -1) / iVar4;
  Term_get_size(&local_34,&local_38);
  col = 0x17;
  if (local_34 - iVar2 < iVar5 * 0x17) {
    col = (local_34 - iVar2) / iVar5;
  }
  if (0 < iVar5) {
    local_58 = 0;
    local_64 = 0;
    do {
      if (0 < iVar4) {
        iVar7 = local_64 * col;
        pos = local_58;
        iVar9 = iVar3;
        iVar8 = iVar4;
        do {
          if (pos < iVar1) {
            display_menu_row(menu,pos,(uint)(cursor == pos),SUB41(iVar9,0),iVar7 + iVar2,col,col);
          }
          iVar9 = iVar9 + 1;
          pos = pos + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      local_64 = local_64 + 1;
      local_58 = local_58 + iVar4;
    } while (local_64 != iVar5);
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(col * (cursor / iVar4) + iVar2 + menu->cursor_x_offset,
                (iVar3 + cursor % iVar4) - *top);
  }
  return;
}

Assistant:

static void display_columns(struct menu *menu, int cursor, int *top, region *loc)
{
	int c, r;
	int w, h;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int cols = (n + rows_per_page - 1) / rows_per_page;
	int colw = 23;

	Term_get_size(&w, &h);

	if ((colw * cols) > (w - col))
		colw = (w - col) / cols;

	for (c = 0; c < cols; c++) {
		for (r = 0; r < rows_per_page; r++) {
			int pos = c * rows_per_page + r;
			bool is_cursor = (pos == cursor);

			if (pos < n)
				display_menu_row(menu, pos, 0, is_cursor,
						row + r, col + c * colw, colw);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + (cursor / rows_per_page) * colw + menu->cursor_x_offset,
				row + (cursor % rows_per_page) - *top);
}